

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_gost2015.c
# Opt level: O1

int gost2015_final_call(EVP_CIPHER_CTX *ctx,EVP_MD_CTX *omac_ctx,size_t mac_size,
                       uchar *encrypted_mac,
                       _func_int_EVP_CIPHER_CTX_ptr_uchar_ptr_uchar_ptr_size_t *do_cipher)

{
  int iVar1;
  uchar calculated_mac [16];
  uchar expected_mac [16];
  size_t local_60;
  uchar local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_60 = mac_size;
  iVar1 = EVP_CIPHER_CTX_is_encrypting();
  if (iVar1 == 0) {
    local_48 = 0;
    uStack_40 = 0;
    EVP_DigestSignFinal((EVP_MD_CTX *)omac_ctx,local_58,&local_60);
    iVar1 = (*do_cipher)(ctx,(uchar *)&local_48,encrypted_mac,local_60);
    if (iVar1 < 1) {
      return -1;
    }
    iVar1 = CRYPTO_memcmp(&local_48,local_58,local_60);
    if (iVar1 != 0) {
      return -1;
    }
  }
  else {
    EVP_DigestSignFinal((EVP_MD_CTX *)omac_ctx,local_58,&local_60);
    iVar1 = (*do_cipher)(ctx,encrypted_mac,local_58,local_60);
    if (iVar1 < 1) {
      return -1;
    }
  }
  return 0;
}

Assistant:

int gost2015_final_call(EVP_CIPHER_CTX *ctx, EVP_MD_CTX *omac_ctx, size_t mac_size,
    unsigned char *encrypted_mac,
    int (*do_cipher) (EVP_CIPHER_CTX *ctx,
    unsigned char *out,
    const unsigned char *in,
    size_t inl))
{
    unsigned char calculated_mac[KUZNYECHIK_MAC_MAX_SIZE];
    memset(calculated_mac, 0, KUZNYECHIK_MAC_MAX_SIZE);

    if (EVP_CIPHER_CTX_encrypting(ctx)) {
        EVP_DigestSignFinal(omac_ctx, calculated_mac, &mac_size);

        if (do_cipher(ctx, encrypted_mac, calculated_mac, mac_size) <= 0) {
            return -1;
        }
    } else {
        unsigned char expected_mac[KUZNYECHIK_MAC_MAX_SIZE];

        memset(expected_mac, 0, KUZNYECHIK_MAC_MAX_SIZE);
        EVP_DigestSignFinal(omac_ctx, calculated_mac, &mac_size);

        if (do_cipher(ctx, expected_mac, encrypted_mac, mac_size) <= 0) {
            return -1;
        }

        if (CRYPTO_memcmp(expected_mac, calculated_mac, mac_size) != 0)
            return -1;
    }
    return 0;
}